

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS5837.h
# Opt level: O1

int ms5837_write_command(MS5837 *pMS5837,uint8_t cmd)

{
  int iVar1;
  ssize_t sVar2;
  uint uVar3;
  ulong uVar4;
  uchar sendbuf [1];
  uint8_t local_129 [265];
  
  iVar1 = (pMS5837->I2CBus).DevType;
  local_129[0] = cmd;
  if (iVar1 == 0) {
    iVar1 = *(int *)&(pMS5837->I2CBus).hDev;
    uVar4 = 0;
    do {
      sVar2 = write(iVar1,local_129 + uVar4,(ulong)(1 - (int)uVar4));
      if ((int)sVar2 < 1) {
        return 1;
      }
      uVar3 = (int)uVar4 + (int)sVar2;
      uVar4 = (ulong)uVar3;
    } while (uVar3 == 0);
  }
  else {
    if (iVar1 != 1) {
      return 1;
    }
    local_129[1] = (uint8_t)(pMS5837->I2CBus).rw_mode;
    local_129[2] = (uint8_t)(pMS5837->I2CBus).i2c_addr;
    local_129[3] = 1;
    iVar1 = (pMS5837->I2CBus).RS232Port.DevType;
    local_129[4] = cmd;
    if (iVar1 - 1U < 4) {
      iVar1 = (pMS5837->I2CBus).RS232Port.s;
      uVar4 = 0;
      do {
        sVar2 = send(iVar1,local_129 + uVar4 + 1,(long)(4 - (int)uVar4),0);
        if ((int)sVar2 < 1) {
          return 1;
        }
        uVar3 = (int)uVar4 + (int)sVar2;
        uVar4 = (ulong)uVar3;
      } while ((int)uVar3 < 4);
    }
    else {
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = *(int *)&(pMS5837->I2CBus).RS232Port.hDev;
      uVar4 = 0;
      do {
        sVar2 = write(iVar1,local_129 + uVar4 + 1,(ulong)(4 - (int)uVar4));
        if ((int)sVar2 < 1) {
          return 1;
        }
        uVar3 = (int)uVar4 + (int)sVar2;
        uVar4 = (ulong)uVar3;
      } while (uVar3 < 4);
    }
  }
  if ((pMS5837->bSaveRawData != 0) && ((FILE *)pMS5837->pfSaveFile != (FILE *)0x0)) {
    fputc((int)(char)cmd,(FILE *)pMS5837->pfSaveFile);
    fflush((FILE *)pMS5837->pfSaveFile);
  }
  return 0;
}

Assistant:

inline int ms5837_write_command(MS5837* pMS5837, uint8_t cmd)
{
	unsigned char sendbuf[1];
	int sendbuflen = 0;

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sendbuf[0] = (unsigned char)cmd;
	sendbuflen = 1;

	if (WriteAllI2CBus(&pMS5837->I2CBus, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pMS5837->bSaveRawData)&&(pMS5837->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pMS5837->pfSaveFile);
		fflush(pMS5837->pfSaveFile);
	}

	return EXIT_SUCCESS;
}